

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluStrUtil.cpp
# Opt level: O1

ostream * glu::operator<<(ostream *str,ApiType apiType)

{
  ostream *this;
  long lVar1;
  char *pcVar2;
  uint uVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>(str,"OpenGL ",7);
  uVar3 = apiType.m_bits >> 8 & 3;
  if (uVar3 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(str,"ES ",3);
  }
  this = (ostream *)std::ostream::operator<<(str,apiType.m_bits & 0xf);
  std::__ostream_insert<char,std::char_traits<char>>(this,".",1);
  std::ostream::operator<<(this,apiType.m_bits >> 4 & 0xf);
  if (uVar3 == 2) {
    pcVar2 = " compatibility profile";
    lVar1 = 0x16;
  }
  else if (uVar3 == 1) {
    pcVar2 = " core profile";
    lVar1 = 0xd;
  }
  else {
    if (uVar3 == 0) {
      return str;
    }
    pcVar2 = " (unknown profile)";
    lVar1 = 0x12;
  }
  std::__ostream_insert<char,std::char_traits<char>>(str,pcVar2,lVar1);
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, ApiType apiType)
{
	str << "OpenGL ";

	if (apiType.getProfile() == PROFILE_ES)
		str << "ES ";

	str << apiType.getMajorVersion() << "." << apiType.getMinorVersion();

	if (apiType.getProfile() == PROFILE_CORE)
		str << " core profile";
	else if (apiType.getProfile() == PROFILE_COMPATIBILITY)
		str << " compatibility profile";
	else if (apiType.getProfile() != PROFILE_ES)
		str << " (unknown profile)";

	return str;
}